

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *input,bool cap_next_letter)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  int i;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    pcVar2 = (input->_M_dataplus)._M_p;
    cVar3 = (char)__return_storage_ptr__;
    if (input->_M_string_length <= uVar4) {
      if (pcVar2[input->_M_string_length - 1] == '#') {
        std::__cxx11::string::push_back(cVar3);
      }
      return __return_storage_ptr__;
    }
    bVar1 = pcVar2[uVar4];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((byte)(bVar1 - 0x30) < 10) {
          std::__cxx11::string::push_back(cVar3);
        }
      }
      else if (bVar1 < 0x5b) goto LAB_0024d6d7;
    }
    else if (bVar1 < 0x7b) {
LAB_0024d6d7:
      std::__cxx11::string::push_back(cVar3);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

string UnderscoresToCamelCase(const string& input, bool cap_next_letter) {
  string result;
  // Note:  I distrust ctype.h due to locales.
  for (int i = 0; i < input.size(); i++) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      if (i == 0 && !cap_next_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += input[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (input[input.size() - 1] == '#') {
    result += '_';
  }
  return result;
}